

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void print_expr(c2m_ctx_t c2m_ctx,FILE *f,expr_conflict *e)

{
  type *type;
  int iVar1;
  char *__format;
  bool bVar2;
  
  fwrite(": ",2,1,(FILE *)f);
  if ((e->u).lvalue_node != (node_t_conflict)0x0) {
    fwrite("lvalue, ",8,1,(FILE *)f);
  }
  print_type(c2m_ctx,f,e->type);
  if ((undefined1  [64])((undefined1  [64])*e & (undefined1  [64])0x1) != (undefined1  [64])0x0) {
    fwrite(", const = ",10,1,(FILE *)f);
    type = e->type;
    if (type->mode == TM_BASIC) {
      bVar2 = (type->u).basic_type - TP_BOOL < 0xc;
    }
    else {
      bVar2 = false;
    }
    if ((type->mode == TM_ENUM) || (bVar2)) {
      iVar1 = signed_integer_type_p(type);
      if (iVar1 == 0) {
        __format = "%llu";
      }
      else {
        __format = "%lld";
      }
      fprintf((FILE *)f,__format,(e->c).i_val);
      return;
    }
    fprintf((FILE *)f," %.*Lg\n",0x40);
  }
  return;
}

Assistant:

static void print_expr (c2m_ctx_t c2m_ctx, FILE *f, struct expr *e) {
  if (e == NULL) return; /* e.g. N_ID which is not an expr */
  fprintf (f, ": ");
  if (e->u.lvalue_node) fprintf (f, "lvalue, ");
  print_type (c2m_ctx, f, e->type);
  if (e->const_p) {
    fprintf (f, ", const = ");
    if (!integer_type_p (e->type)) {
      fprintf (f, " %.*Lg\n", LDBL_MANT_DIG, (long double) e->c.d_val);
    } else if (signed_integer_type_p (e->type)) {
      fprintf (f, "%lld", (long long) e->c.i_val);
    } else {
      fprintf (f, "%llu", (unsigned long long) e->c.u_val);
    }
  }
}